

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString StringFromOrdinalNumber(uint number)

{
  uint uVar1;
  char *pcVar2;
  uint in_ESI;
  undefined4 in_register_0000003c;
  
  pcVar2 = "th";
  if ((2 < in_ESI - 0xb) && (uVar1 = ~((in_ESI / 10) * 10) + in_ESI, uVar1 < 3)) {
    pcVar2 = &DAT_001b175c + *(int *)(&DAT_001b175c + (ulong)uVar1 * 4);
  }
  StringFromFormat((char *)CONCAT44(in_register_0000003c,number),"%u%s",(ulong)in_ESI,pcVar2);
  return (SimpleString)(char *)CONCAT44(in_register_0000003c,number);
}

Assistant:

SimpleString StringFromOrdinalNumber(unsigned int number)
{
    unsigned int onesDigit = number % 10;

    const char* suffix;
    if (number >= 11 && number <= 13) {
        suffix = "th";
    } else if (3 == onesDigit) {
        suffix = "rd";
    } else if (2 == onesDigit) {
        suffix = "nd";
    } else if (1 == onesDigit) {
        suffix = "st";
    } else {
        suffix = "th";
    }

    return StringFromFormat("%u%s", number, suffix);
}